

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

void Gia_ObjSetLevelId(Gia_Man_t *p,int Id,int l)

{
  int l_local;
  int Id_local;
  Gia_Man_t *p_local;
  
  Vec_IntSetEntry(p->vLevels,Id,l);
  return;
}

Assistant:

static inline void         Gia_ObjSetLevelId( Gia_Man_t * p, int Id, int l )   { Vec_IntSetEntry(p->vLevels, Id, l);                        }